

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O3

void maxHeapify(HighsInt *heap_v,HighsInt *heap_i,HighsInt i,HighsInt n)

{
  int iVar1;
  HighsInt HVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = heap_v[i];
  HVar2 = heap_i[i];
  for (uVar4 = i * 2; (int)uVar4 <= n; uVar4 = uVar4 * 2) {
    uVar3 = uVar4;
    if (((int)uVar4 < n) && (uVar3 = uVar4 | 1, heap_v[(int)(uVar4 | 1)] <= heap_v[(int)uVar4])) {
      uVar3 = uVar4;
    }
    uVar4 = uVar3;
    if (heap_v[(int)uVar4] < iVar1) break;
    heap_v[(int)uVar4 / 2] = heap_v[(int)uVar4];
    heap_i[(int)uVar4 / 2] = heap_i[(int)uVar4];
  }
  heap_v[(int)uVar4 / 2] = iVar1;
  heap_i[(int)uVar4 / 2] = HVar2;
  return;
}

Assistant:

void maxHeapify(HighsInt* heap_v, HighsInt* heap_i, HighsInt i, HighsInt n) {
  HighsInt temp_v;
  HighsInt j, temp_i;
  temp_v = heap_v[i];
  temp_i = heap_i[i];
  j = 2 * i;
  while (j <= n) {
    if (j < n && heap_v[j + 1] > heap_v[j]) j = j + 1;
    if (temp_v > heap_v[j])
      break;
    else if (temp_v <= heap_v[j]) {
      heap_v[j / 2] = heap_v[j];
      heap_i[j / 2] = heap_i[j];
      j = 2 * j;
    }
  }
  heap_v[j / 2] = temp_v;
  heap_i[j / 2] = temp_i;
  return;
}